

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHeader_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamHeader::ReadHeaderText(BamHeader *this,BgzfStream *stream,uint32_t *length)

{
  uint uVar1;
  char *data;
  size_t sVar2;
  BamException *this_00;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  
  uVar1 = *length;
  data = (char *)calloc((ulong)(uVar1 + 1),1);
  sVar2 = BgzfStream::Read(stream,data,(ulong)uVar1);
  if (sVar2 == *length) {
    std::__cxx11::string::string((string *)&local_70,data,(allocator *)&local_50);
    SamHeader::SetHeaderText(&this->m_header,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    free(data);
    return;
  }
  free(data);
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_70,"BamHeader::ReadHeaderText",&local_71);
  std::__cxx11::string::string((string *)&local_50,"could not read header text",&local_72);
  BamException::BamException(this_00,&local_70,&local_50);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamHeader::ReadHeaderText(BgzfStream* stream, const uint32_t& length)
{

    // read header text
    char* headerText = (char*)calloc(length + 1, 1);
    const std::size_t bytesRead = stream->Read(headerText, length);

    // if error reading, clean up buffer & throw
    if (bytesRead != length) {
        free(headerText);
        throw BamException("BamHeader::ReadHeaderText", "could not read header text");
    }

    // otherwise, text was read OK
    // store & cleanup
    m_header.SetHeaderText(static_cast<std::string>((const char*)headerText));
    free(headerText);
}